

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotErrorBarsHEx<ImPlot::GetterError<long_long>>
               (char *label_id,GetterError<long_long> *getter)

{
  float fVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col;
  ImDrawList *this;
  int i;
  int iVar4;
  float fVar5;
  ImVec2 local_a8;
  ImVec2 p1;
  ImPlotPointError e;
  ImVec2 local_68;
  ImVec2 p2;
  
  bVar3 = BeginItem(label_id,-1);
  if (bVar3) {
    if (GImPlot->FitThisFrame == true) {
      for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
        GetterError<long_long>::operator()(&e,getter,iVar4);
        p1 = (ImVec2)(e.X - e.Neg);
        FitPoint((ImPlotPoint *)&p1);
        p1 = (ImVec2)(e.X + e.Pos);
        FitPoint((ImPlotPoint *)&p1);
      }
    }
    pIVar2 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 4);
    fVar1 = (pIVar2->NextItemData).ErrorBarSize;
    fVar5 = fVar1 * 0.5;
    for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
      GetterError<long_long>::operator()(&e,getter,iVar4);
      p1 = PlotToPixels(e.X - e.Neg,e.Y,-1);
      p2 = PlotToPixels(e.X + e.Pos,e.Y,-1);
      ImDrawList::AddLine(this,&p1,&p2,col,(pIVar2->NextItemData).ErrorBarWeight);
      if (0.0 < fVar1) {
        local_68.x = p1.x;
        local_68.y = p1.y - fVar5;
        local_a8.y = fVar5 + p1.y;
        local_a8.x = local_68.x + 0.0;
        ImDrawList::AddLine(this,&local_68,&local_a8,col,(pIVar2->NextItemData).ErrorBarWeight);
        local_68.x = p2.x;
        local_68.y = p2.y - fVar5;
        local_a8.y = fVar5 + p2.y;
        local_a8.x = local_68.x + 0.0;
        ImDrawList::AddLine(this,&local_68,&local_a8,col,(pIVar2->NextItemData).ErrorBarWeight);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotErrorBarsHEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X - e.Neg, e.Y));
                FitPoint(ImPlotPoint(e.X + e.Pos, e.Y));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X - e.Neg, e.Y);
            ImVec2 p2 = PlotToPixels(e.X + e.Pos, e.Y);
            DrawList.AddLine(p1, p2, col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(0, half_whisker), p1 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(0, half_whisker), p2 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}